

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int http2_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *sock)

{
  uint uVar1;
  HTTP *pHVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  pHVar2 = (data->req).p.http;
  *sock = conn->sock[0];
  uVar1 = (data->req).keepon;
  bVar7 = (uVar1 & 0x10) == 0;
  uVar5 = (uint)bVar7;
  uVar6 = uVar5;
  if ((((uVar1 & 0x22) == 2) ||
      (iVar3 = nghttp2_session_want_write((conn->proto).httpc.h2), iVar3 != 0)) &&
     (iVar4 = nghttp2_session_get_remote_window_size((conn->proto).httpc.h2), iVar4 != 0)) {
    iVar4 = nghttp2_session_get_stream_remote_window_size((conn->proto).httpc.h2,pHVar2->stream_id);
    uVar6 = bVar7 + 0x10000;
    if (iVar4 == 0) {
      uVar6 = uVar5;
    }
  }
  return uVar6;
}

Assistant:

static int http2_getsock(struct Curl_easy *data,
                         struct connectdata *conn,
                         curl_socket_t *sock)
{
  const struct http_conn *c = &conn->proto.httpc;
  struct SingleRequest *k = &data->req;
  int bitmap = GETSOCK_BLANK;
  struct HTTP *stream = data->req.p.http;

  sock[0] = conn->sock[FIRSTSOCKET];

  if(!(k->keepon & KEEP_RECV_PAUSE))
    /* Unless paused - in a HTTP/2 connection we can basically always get a
       frame so we should always be ready for one */
    bitmap |= GETSOCK_READSOCK(FIRSTSOCKET);

  /* we're (still uploading OR the HTTP/2 layer wants to send data) AND
     there's a window to send data in */
  if((((k->keepon & (KEEP_SEND|KEEP_SEND_PAUSE)) == KEEP_SEND) ||
      nghttp2_session_want_write(c->h2)) &&
     (nghttp2_session_get_remote_window_size(c->h2) &&
      nghttp2_session_get_stream_remote_window_size(c->h2,
                                                    stream->stream_id)))
    bitmap |= GETSOCK_WRITESOCK(FIRSTSOCKET);

  return bitmap;
}